

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O0

int __thiscall Imf_3_4::Zip::compress(Zip *this,char *raw,int rawSize,char *compressed)

{
  byte bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  BaseExc *this_00;
  undefined8 in_RCX;
  undefined1 *puVar6;
  int in_EDX;
  undefined1 *puVar7;
  undefined1 *in_RSI;
  long in_RDI;
  size_t outSize;
  int d;
  int p;
  uchar *stop_1;
  uchar *t;
  char *stop;
  char *t2;
  char *t1;
  int local_58 [2];
  int local_50;
  uint local_4c;
  byte *local_48;
  byte *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_10;
  
  local_38 = in_RSI + in_EDX;
  local_30 = (undefined1 *)(*(long *)(in_RDI + 8) + (long)((in_EDX + 1) / 2));
  local_28 = *(undefined1 **)(in_RDI + 8);
  local_10 = in_RSI;
  while (puVar6 = local_10, local_10 < local_38) {
    puVar6 = local_10 + 1;
    puVar7 = local_28 + 1;
    *local_28 = *local_10;
    local_28 = puVar7;
    if (local_38 <= puVar6) break;
    local_10 = local_10 + 2;
    *local_30 = *puVar6;
    local_30 = local_30 + 1;
  }
  local_10 = puVar6;
  local_40 = *(byte **)(in_RDI + 8);
  local_48 = (byte *)(*(long *)(in_RDI + 8) + (long)in_EDX);
  bVar1 = *local_40;
  while( true ) {
    local_40 = local_40 + 1;
    local_4c = (uint)bVar1;
    if (local_48 <= local_40) break;
    local_50 = (*local_40 - local_4c) + 0x180;
    bVar1 = *local_40;
    *local_40 = (byte)local_50;
  }
  uVar2 = *(undefined4 *)(in_RDI + 0x10);
  uVar3 = *(undefined8 *)(in_RDI + 8);
  sVar5 = maxCompressedSize((Zip *)0x2580be);
  iVar4 = exr_compress_buffer(0,uVar2,uVar3,(long)in_EDX,in_RCX,sVar5,local_58);
  if (iVar4 == 0) {
    return local_58[0];
  }
  this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::BaseExc::BaseExc(this_00,"Data compression failed.");
  __cxa_throw(this_00,&Iex_3_4::BaseExc::typeinfo,Iex_3_4::BaseExc::~BaseExc);
}

Assistant:

int
Zip::compress (const char* raw, int rawSize, char* compressed)
{
    //
    // Reorder the pixel data.
    //

    {
        char*       t1   = _tmpBuffer;
        char*       t2   = _tmpBuffer + (rawSize + 1) / 2;
        const char* stop = raw + rawSize;

        while (true)
        {
            if (raw < stop)
                *(t1++) = *(raw++);
            else
                break;

            if (raw < stop)
                *(t2++) = *(raw++);
            else
                break;
        }
    }

    //
    // Predictor.
    //

    {
        unsigned char* t    = (unsigned char*) _tmpBuffer + 1;
        unsigned char* stop = (unsigned char*) _tmpBuffer + rawSize;
        int            p    = t[-1];

        while (t < stop)
        {
            int d = int (t[0]) - p + (128 + 256);
            p     = t[0];
            t[0]  = d;
            ++t;
        }
    }

    //
    // Compress the data using zlib
    //
    size_t outSize;
    if (EXR_ERR_SUCCESS != exr_compress_buffer (
                               nullptr,
                               _zipLevel,
                               _tmpBuffer,
                               rawSize,
                               compressed,
                               maxCompressedSize (),
                               &outSize))
    {
        throw IEX_NAMESPACE::BaseExc ("Data compression failed.");
    }

    return outSize;
}